

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_serialize_fromfile(FILE *in)

{
  undefined8 uVar1;
  uint6 uVar2;
  size_t sVar3;
  MDD ifneq;
  MDD ifeq;
  lddmc_ser *data;
  ulong uVar4;
  int local_6c;
  FILE *local_68;
  ulong local_60;
  mddnode node;
  size_t count;
  lddmc_ser local_40;
  
  uVar4 = 1;
  local_68 = (FILE *)in;
  sVar3 = fread(&count,8,1,(FILE *)in);
  if (sVar3 == 1) {
    local_60 = count;
    while( true ) {
      if (local_60 < uVar4) {
        return;
      }
      sVar3 = fread(&node,0x10,1,local_68);
      if (sVar3 != 1) break;
      if (lddmc_ser_done + 1 < (ulong)((uint6)node.a >> 1)) {
        __assert_fail("mddnode_getright(&node) <= lddmc_ser_done+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa29,"void lddmc_serialize_fromfile(FILE *)");
      }
      uVar1 = CONCAT62(node.b._2_6_,(undefined2)node.b);
      uVar2 = node.b._2_6_ >> 1;
      if (lddmc_ser_done + 1 < (ulong)uVar2) {
        __assert_fail("mddnode_getdown(&node) <= lddmc_ser_done+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa2a,"void lddmc_serialize_fromfile(FILE *)");
      }
      ifneq = lddmc_serialize_get_reversed((ulong)((uint6)node.a >> 1));
      ifeq = lddmc_serialize_get_reversed((ulong)uVar2);
      if (((uint)uVar1 >> 0x10 & 1) == 0) {
        local_40.mdd = lddmc_makenode(CONCAT22((undefined2)node.b,node.a._6_2_),ifeq,ifneq);
      }
      else {
        local_40.mdd = lddmc_make_copynode(ifeq,ifneq);
      }
      local_6c = 0;
      local_40.assigned = lddmc_ser_done + 2;
      lddmc_ser_done = lddmc_ser_done + 1;
      data = &local_40;
      lddmc_ser_put(&lddmc_ser_set,&local_40,&local_6c);
      lddmc_ser_reversed_insert((avl_node_t **)&local_40,data);
      uVar4 = uVar4 + 1;
    }
  }
  puts("sylvan_serialize_fromfile: file format error, giving up");
  exit(-1);
}

Assistant:

void
lddmc_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct mddnode node;
        if (fread(&node, sizeof(struct mddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        assert(mddnode_getright(&node) <= lddmc_ser_done+1);
        assert(mddnode_getdown(&node) <= lddmc_ser_done+1);

        MDD right = lddmc_serialize_get_reversed(mddnode_getright(&node));
        MDD down = lddmc_serialize_get_reversed(mddnode_getdown(&node));

        struct lddmc_ser s;
        if (mddnode_getcopy(&node)) s.mdd = lddmc_make_copynode(down, right);
        else s.mdd = lddmc_makenode(mddnode_getvalue(&node), down, right);
        s.assigned = lddmc_ser_done+2; // starts at 0 but we want 2-based...
        lddmc_ser_done++;

        lddmc_ser_insert(&lddmc_ser_set, &s);
        lddmc_ser_reversed_insert(&lddmc_ser_reversed_set, &s);
    }
}